

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterCompareInt
              (SortSubtask *pTask,int *pbKey2Cached,void *pKey1,int nKey1,void *pKey2,int nKey2)

{
  uint uVar1;
  uint uVar2;
  byte *pKey1_00;
  byte *pbVar3;
  byte *in_RDX;
  long in_RDI;
  SortSubtask *in_R8;
  int i;
  u8 n;
  int res;
  u8 *v2;
  u8 *v1;
  int s2;
  int s1;
  u8 *p2;
  u8 *p1;
  int in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffa0;
  int iVar4;
  
  uVar1 = (uint)in_RDX[1];
  uVar2 = (uint)*(byte *)((long)&in_R8->pThread + 1);
  pKey1_00 = in_RDX + *in_RDX;
  pbVar3 = (byte *)((long)&in_R8->pThread + (ulong)*(byte *)&in_R8->pThread);
  if (uVar1 == uVar2) {
    in_stack_ffffffffffffffa0 = CONCAT13(""[(int)uVar1],(int3)in_stack_ffffffffffffffa0);
    iVar4 = 0;
    for (in_stack_ffffffffffffff9c = 0; in_stack_ffffffffffffff9c < (int)(uint)""[(int)uVar1];
        in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c + 1) {
      iVar4 = (uint)pKey1_00[in_stack_ffffffffffffff9c] - (uint)pbVar3[in_stack_ffffffffffffff9c];
      if (iVar4 != 0) {
        if ((((*pKey1_00 ^ *pbVar3) & 0x80) != 0) && (iVar4 = 1, (*pKey1_00 & 0x80) != 0)) {
          iVar4 = -1;
        }
        break;
      }
    }
  }
  else if ((uVar1 < 8) || (uVar2 < 8)) {
    if (uVar2 < 8) {
      if (uVar1 < 8) {
        iVar4 = uVar1 - uVar2;
      }
      else {
        iVar4 = -1;
      }
    }
    else {
      iVar4 = 1;
    }
    if (iVar4 < 1) {
      if ((*pbVar3 & 0x80) != 0) {
        iVar4 = 1;
      }
    }
    else if ((*pKey1_00 & 0x80) != 0) {
      iVar4 = -1;
    }
  }
  else {
    iVar4 = uVar1 - uVar2;
  }
  if (iVar4 == 0) {
    if (1 < *(ushort *)(*(long *)(*(long *)(in_RDI + 0x10) + 0x28) + 6)) {
      iVar4 = vdbeSorterCompareTail
                        (in_R8,(int *)(ulong)CONCAT14(in_RDX[1],uVar2),pKey1_00,
                         (int)((ulong)pbVar3 >> 0x20),(void *)(ulong)in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff9c);
    }
  }
  else if (**(char **)(*(long *)(*(long *)(in_RDI + 0x10) + 0x28) + 0x18) != '\0') {
    iVar4 = -iVar4;
  }
  return iVar4;
}

Assistant:

static int vdbeSorterCompareInt(
  SortSubtask *pTask,             /* Subtask context (for pKeyInfo) */
  int *pbKey2Cached,              /* True if pTask->pUnpacked is pKey2 */
  const void *pKey1, int nKey1,   /* Left side of comparison */
  const void *pKey2, int nKey2    /* Right side of comparison */
){
  const u8 * const p1 = (const u8 * const)pKey1;
  const u8 * const p2 = (const u8 * const)pKey2;
  const int s1 = p1[1];                 /* Left hand serial type */
  const int s2 = p2[1];                 /* Right hand serial type */
  const u8 * const v1 = &p1[ p1[0] ];   /* Pointer to value 1 */
  const u8 * const v2 = &p2[ p2[0] ];   /* Pointer to value 2 */
  int res;                              /* Return value */

  assert( (s1>0 && s1<7) || s1==8 || s1==9 );
  assert( (s2>0 && s2<7) || s2==8 || s2==9 );

  if( s1==s2 ){
    /* The two values have the same sign. Compare using memcmp(). */
    static const u8 aLen[] = {0, 1, 2, 3, 4, 6, 8, 0, 0, 0 };
    const u8 n = aLen[s1];
    int i;
    res = 0;
    for(i=0; i<n; i++){
      if( (res = v1[i] - v2[i])!=0 ){
        if( ((v1[0] ^ v2[0]) & 0x80)!=0 ){
          res = v1[0] & 0x80 ? -1 : +1;
        }
        break;
      }
    }
  }else if( s1>7 && s2>7 ){
    res = s1 - s2;
  }else{
    if( s2>7 ){
      res = +1;
    }else if( s1>7 ){
      res = -1;
    }else{
      res = s1 - s2;
    }
    assert( res!=0 );

    if( res>0 ){
      if( *v1 & 0x80 ) res = -1;
    }else{
      if( *v2 & 0x80 ) res = +1;
    }
  }

  if( res==0 ){
    if( pTask->pSorter->pKeyInfo->nKeyField>1 ){
      res = vdbeSorterCompareTail(
          pTask, pbKey2Cached, pKey1, nKey1, pKey2, nKey2
      );
    }
  }else if( pTask->pSorter->pKeyInfo->aSortFlags[0] ){
    assert( !(pTask->pSorter->pKeyInfo->aSortFlags[0]&KEYINFO_ORDER_BIGNULL) );
    res = res * -1;
  }

  return res;
}